

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void __thiscall
JsonParser_deserialize_fu16_string_Test::TestBody(JsonParser_deserialize_fu16_string_Test *this)

{
  bool bVar1;
  char *pcVar2;
  __sv_type _Var3;
  AssertHelper local_d8 [8];
  Message local_d0 [8];
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_c8;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  size_t local_98;
  char *local_90;
  undefined1 local_88 [8];
  object obj;
  undefined1 local_38 [8];
  string fu16text;
  json_parser parser;
  JsonParser_deserialize_fu16_string_Test *this_local;
  
  jessilib::json_parser::json_parser((json_parser *)(fu16text.field_2._M_local_buf + 8));
  join_0x00000010_0x00000000_ = sv(L"\"text\"",6);
  make_foreign_string<char16_t>((string *)local_38,join_0x00000010_0x00000000_);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
  local_98 = _Var3._M_len;
  local_90 = _Var3._M_str;
  jessilib::json_parser::deserialize_bytes
            (local_88,(json_parser *)(fu16text.field_2._M_local_buf + 8),local_98,local_90,2);
  local_c8 = sv("text",4);
  testing::internal::EqHelper::
  Compare<jessilib::object,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_nullptr>
            ((EqHelper *)local_b8,"obj","u8\"text\"sv",(object *)local_88,&local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0x126,pcVar2);
    testing::internal::AssertHelper::operator=(local_d8,local_d0);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    testing::Message::~Message(local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  jessilib::object::~object((object *)local_88);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

TEST(JsonParser, deserialize_fu16_string) {
	json_parser parser;
	std::string fu16text = make_foreign_string(uR"json("text")json"sv);

	// Deserialize foreign utf-16 text
	object obj = parser.deserialize_bytes(fu16text, text_encoding::utf_16_foreign);
	EXPECT_EQ(obj, u8"text"sv);
}